

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::AddRequiredTargetFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  char *pcVar6;
  size_t sVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  ostream *poVar9;
  long *plVar10;
  size_type *psVar11;
  string lang;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableFeatures;
  ostringstream e;
  string local_268;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  sVar5 = cmGeneratorExpression::Find(feature);
  if (sVar5 == 0xffffffffffffffff) {
    local_248._M_string_length = 0;
    local_248.field_2._M_local_buf[0] = '\0';
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    bVar3 = CompileFeatureKnown(this,target,feature,&local_248,error);
    if ((bVar3) && (pcVar6 = CompileFeaturesAvailable(this,&local_248,error), pcVar6 != (char *)0x0)
       ) {
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar2 = local_1a8 + 0x10;
      local_1a8._0_8_ = pcVar2;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar6,pcVar6 + sVar7);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&local_228,false);
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_228.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_228.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,feature);
      if (_Var8._M_current ==
          local_228.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The compiler feature \"",0x16);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(feature->_M_dataplus)._M_p,
                            feature->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" is not known to ",0x12);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_248._M_dataplus._M_p,local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," compiler\n\"",0xb);
        std::operator+(&local_1c8,"CMAKE_",&local_248);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        paVar1 = &local_268.field_2;
        psVar11 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_268.field_2._M_allocated_capacity = *psVar11;
          local_268.field_2._8_8_ = plVar10[3];
          local_268._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar11;
          local_268._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_268._M_string_length = plVar10[1];
        *plVar10 = (long)psVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        pcVar6 = GetDefinition(this,&local_268);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\nversion ",10);
        std::operator+(&local_1e8,"CMAKE_",&local_248);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        psVar11 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_208.field_2._M_allocated_capacity = *psVar11;
          local_208.field_2._8_8_ = plVar10[3];
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar11;
          local_208._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_208._M_string_length = plVar10[1];
        *plVar10 = (long)psVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        pcVar6 = GetDefinition(this,&local_208);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar1) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar1) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
      }
      else {
        local_1a8._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"COMPILE_FEATURES","");
        cmTarget::AppendProperty(target,(string *)local_1a8,(feature->_M_dataplus)._M_p,false);
        if ((pointer)local_1a8._0_8_ != pcVar2) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_248);
        if (iVar4 == 0) {
          bVar3 = AddRequiredTargetCFeature(this,target,feature);
        }
        else {
          bVar3 = AddRequiredTargetCxxFeature(this,target,feature);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_228);
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"COMPILE_FEATURES","");
    cmTarget::AppendProperty(target,(string *)local_1a8,(feature->_M_dataplus)._M_p,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool cmMakefile::
AddRequiredTargetFeature(cmTarget *target, const std::string& feature,
                         std::string *error) const
{
  if (cmGeneratorExpression::Find(feature) != std::string::npos)
    {
    target->AppendProperty("COMPILE_FEATURES", feature.c_str());
    return true;
    }

  std::string lang;
  if (!this->CompileFeatureKnown(target, feature, lang, error))
    {
    return false;
    }

  const char* features = this->CompileFeaturesAvailable(lang, error);
  if (!features)
    {
    return false;
    }

  std::vector<std::string> availableFeatures;
  cmSystemTools::ExpandListArgument(features, availableFeatures);
  if (std::find(availableFeatures.begin(),
                availableFeatures.end(),
                feature) == availableFeatures.end())
    {
    std::ostringstream e;
    e << "The compiler feature \"" << feature
      << "\" is not known to " << lang << " compiler\n\""
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
    }

  target->AppendProperty("COMPILE_FEATURES", feature.c_str());

  return lang == "C"
      ? this->AddRequiredTargetCFeature(target, feature)
      : this->AddRequiredTargetCxxFeature(target, feature);
}